

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O0

CreateExtkeyResponseStruct *
cfd::js::api::HDWalletStructApi::CreateExtkeyFromParent
          (CreateExtkeyResponseStruct *__return_storage_ptr__,
          CreateExtkeyFromParentRequestStruct *request)

{
  CreateExtkeyFromParentRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  CreateExtkeyFromParentRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  CreateExtkeyFromParentRequestStruct *request_local;
  CreateExtkeyResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  CreateExtkeyResponseStruct::CreateExtkeyResponseStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct(cfd::js::api::CreateExtkeyFromParentRequestStruct_const&)>
  ::
  function<cfd::js::api::HDWalletStructApi::CreateExtkeyFromParent(cfd::js::api::CreateExtkeyFromParentRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::CreateExtkeyResponseStruct(cfd::js::api::CreateExtkeyFromParentRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"CreateExtkeyFromParent",&local_129);
  ExecuteStructApi<cfd::js::api::CreateExtkeyFromParentRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
            ((CreateExtkeyResponseStruct *)(local_108 + 0x20),(api *)this,
             (CreateExtkeyFromParentRequestStruct *)local_108,&local_128,in_R8);
  CreateExtkeyResponseStruct::operator=
            (__return_storage_ptr__,(CreateExtkeyResponseStruct *)(local_108 + 0x20));
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct
            ((CreateExtkeyResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentRequestStruct_&)>
  ::~function((function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

CreateExtkeyResponseStruct HDWalletStructApi::CreateExtkeyFromParent(
    const CreateExtkeyFromParentRequestStruct& request) {
  auto call_func = [](const CreateExtkeyFromParentRequestStruct& request)
      -> CreateExtkeyResponseStruct {
    CreateExtkeyResponseStruct response;
    const NetType net_type = AddressStructApi::ConvertNetType(request.network);
    ExtKeyType key_type = ConvertExtKeyType(request.extkey_type);
    HDWalletApi api;

    response.extkey = api.CreateExtkeyFromParent(
        request.extkey, net_type, key_type, request.child_number,
        request.hardened);

    return response;
  };

  CreateExtkeyResponseStruct result;
  result = ExecuteStructApi<
      CreateExtkeyFromParentRequestStruct, CreateExtkeyResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}